

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix3d * tinyusdz::transpose(matrix3d *__return_storage_ptr__,matrix3d *_m)

{
  V *pVVar1;
  double *pdVar2;
  mat<double,_3,_3> *m_00;
  mat<double,_3,_3> local_e8;
  undefined1 local_a0 [8];
  matrix33d tm;
  matrix33d m;
  matrix3d *_m_local;
  
  linalg::mat<double,_3,_3>::mat((mat<double,_3,_3> *)&tm.z.z);
  linalg::mat<double,_3,_3>::mat((mat<double,_3,_3> *)local_a0);
  pVVar1 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)&tm.z.z,0);
  pdVar2 = linalg::vec<double,_3>::operator[](pVVar1,0);
  memcpy(pdVar2,_m,0x48);
  linalg::transpose<double,3>(&local_e8,(linalg *)&tm.z.z,m_00);
  memcpy(local_a0,&local_e8,0x48);
  value::matrix3d::matrix3d(__return_storage_ptr__);
  pVVar1 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_a0,0);
  pdVar2 = linalg::vec<double,_3>::operator[](pVVar1,0);
  memcpy(__return_storage_ptr__,pdVar2,0x48);
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d transpose(const value::matrix3d &_m) {
  matrix33d m;
  matrix33d tm;
  // memory layout is same
  memcpy(&m[0][0], _m.m, sizeof(double) * 3 * 3);
  tm = linalg::transpose(m);

  value::matrix3d dst;

  // memory layout is same
  memcpy(&dst.m[0][0], &tm[0][0], sizeof(double) * 3 * 3);

  return dst;
}